

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

Argument * __thiscall argparse::Argument::default_value<bool>(Argument *this,bool *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  NArgsRange::NArgsRange((NArgsRange *)&local_48,0,(this->m_num_args_range).m_max);
  *(undefined4 *)&(this->m_num_args_range).m_min = local_48._M_dataplus._M_p._0_4_;
  *(undefined4 *)((long)&(this->m_num_args_range).m_min + 4) = local_48._M_dataplus._M_p._4_4_;
  *(undefined4 *)&(this->m_num_args_range).m_max = (undefined4)local_48._M_string_length;
  *(undefined4 *)((long)&(this->m_num_args_range).m_max + 4) = local_48._M_string_length._4_4_;
  pcVar3 = "false";
  if ((ulong)*value != 0) {
    pcVar3 = "true";
  }
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar3,pcVar3 + ((ulong)*value ^ 5));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_default_value_repr,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  bVar2 = *value;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_48,1,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_48._M_dataplus._M_p,1,(uint)bVar2);
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)&this->m_default_value_str,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::any::operator=(&this->m_default_value,value);
  return this;
}

Assistant:

Argument &default_value(T &&value) {
    m_num_args_range = NArgsRange{0, m_num_args_range.get_max()};
    m_default_value_repr = details::repr(value);

    if constexpr (std::is_convertible_v<T, std::string_view>) {
      m_default_value_str = std::string{std::string_view{value}};
    } else if constexpr (details::can_invoke_to_string<T>::value) {
      m_default_value_str = std::to_string(value);
    }

    m_default_value = std::forward<T>(value);
    return *this;
  }